

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O0

void __thiscall
QNetworkRequestFactory::setBearerToken(QNetworkRequestFactory *this,QByteArray *token)

{
  bool bVar1;
  QNetworkRequestFactoryPrivate *pQVar2;
  QByteArray *in_RSI;
  QByteArray *in_RDI;
  QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate> *in_stack_ffffffffffffffe0;
  
  QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::operator->
            ((QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate> *)0x327bf1);
  bVar1 = ::operator==(in_RSI,in_RDI);
  if (!bVar1) {
    QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach(in_stack_ffffffffffffffe0);
    pQVar2 = QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate> *)0x327c28);
    QByteArray::operator=(&pQVar2->bearerToken,in_RSI);
  }
  return;
}

Assistant:

void QNetworkRequestFactory::setBearerToken(const QByteArray &token)
{
    if (d->bearerToken == token)
        return;

    d.detach();
    d->bearerToken = token;
}